

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall CDirectiveFile::writeSymData(CDirectiveFile *this,SymbolData *symData)

{
  int iVar1;
  element_type *peVar2;
  long lStack_8;
  
  iVar1 = *(int *)&(this->super_CAssemblerCommand).field_0x14;
  if (iVar1 - 1U < 3) {
    peVar2 = (this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    lStack_8 = 0x68;
  }
  else {
    if ((iVar1 != 4) ||
       (peVar2 = (element_type *)
                 (this->closeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr, peVar2 == (element_type *)0x0)) {
      return;
    }
    lStack_8 = 0x70;
  }
  (**(code **)((long)(peVar2->super_AssemblerFile)._vptr_AssemblerFile + lStack_8))();
  return;
}

Assistant:

void CDirectiveFile::writeSymData(SymbolData& symData) const
{
	switch (type)
	{
	case Type::Open:
	case Type::Create:
	case Type::Copy:
		file->beginSymData(symData);
		break;
	case Type::Close:
		if (closeFile)
			closeFile->endSymData(symData);
		break;
	case Type::Invalid:
		// TODO: Assert?
		break;
	}
}